

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O0

bool anon_unknown.dwarf_1486d0f::ElfHeaderCheck<unsigned_long_long,_(QSysInfo::Endian)1>::checkIdent
               (Ehdr *header)

{
  bool bVar1;
  uchar *in_RDI;
  undefined1 local_9;
  
  bVar1 = ElfHeaderCommonCheck::checkElfMagic(in_RDI);
  local_9 = false;
  if (bVar1) {
    bVar1 = checkClass(in_RDI);
    local_9 = false;
    if (bVar1) {
      bVar1 = checkDataOrder(in_RDI);
      local_9 = false;
      if (bVar1) {
        bVar1 = ElfHeaderCommonCheck::checkElfVersion(in_RDI);
        local_9 = false;
        if (bVar1) {
          bVar1 = checkOsAbi(in_RDI);
          local_9 = false;
          if (bVar1) {
            bVar1 = checkAbiVersion(in_RDI);
            local_9 = false;
            if (bVar1) {
              local_9 = checkPadding(in_RDI);
            }
          }
        }
      }
    }
  }
  return local_9;
}

Assistant:

static bool checkIdent(const Ehdr &header)
    {
        return checkElfMagic(header.e_ident)
                && checkClass(header.e_ident)
                && checkDataOrder(header.e_ident)
                && checkElfVersion(header.e_ident)
                && checkOsAbi(header.e_ident)
                && checkAbiVersion(header.e_ident)
                && checkPadding(header.e_ident);
    }